

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_2x2_pack8.h
# Opt level: O0

void ncnn::pooling2x2s2_max_pack8_avx(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  float *pfVar3;
  long in_RSI;
  long in_RDI;
  __m256 _max;
  __m256 _max1;
  __m256 _max0;
  __m256 _r11;
  __m256 _r10;
  __m256 _r01;
  __m256 _r00;
  int j;
  int i;
  float *r1;
  float *r0;
  float *outptr;
  Mat img0;
  int q;
  int tailstep;
  int outh;
  int outw;
  int inch;
  int w;
  undefined8 local_320;
  Mat *this;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  int local_230;
  int local_22c;
  undefined1 (*local_228) [32];
  undefined1 (*local_220) [32];
  Mat local_208;
  float *local_1c0;
  Mat local_1b8;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  undefined1 (*local_140) [32];
  undefined1 (*local_138) [32];
  undefined1 (*local_130) [32];
  undefined1 (*local_128) [32];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  float *local_38;
  
  local_15c = *(int *)(in_RDI + 0x2c);
  local_160 = *(int *)(in_RDI + 0x38);
  local_164 = *(int *)(in_RSI + 0x2c);
  local_168 = *(int *)(in_RSI + 0x30);
  local_16c = (local_15c * 2 + local_164 * -2) * 8;
  for (local_170 = 0; local_170 < local_160; local_170 = local_170 + 1) {
    Mat::channel(this,local_320._12_4_);
    Mat::channel(this,local_320._12_4_);
    pfVar3 = Mat::operator_cast_to_float_(&local_208);
    Mat::~Mat((Mat *)0x4c5cec);
    local_1c0 = pfVar3;
    local_220 = (undefined1 (*) [32])Mat::row(&local_1b8,0);
    local_228 = (undefined1 (*) [32])Mat::row(&local_1b8,1);
    for (local_22c = 0; local_22c < local_168; local_22c = local_22c + 1) {
      for (local_230 = 0; local_230 < local_164; local_230 = local_230 + 1) {
        local_128 = local_220;
        local_80 = *(undefined8 *)*local_220;
        uStack_78 = *(undefined8 *)(*local_220 + 8);
        uStack_70 = *(undefined8 *)(*local_220 + 0x10);
        uStack_68 = *(undefined8 *)(*local_220 + 0x18);
        local_130 = local_220 + 1;
        local_a0 = *(undefined8 *)*local_130;
        uStack_98 = *(undefined8 *)(local_220[1] + 8);
        uStack_90 = *(undefined8 *)(local_220[1] + 0x10);
        uStack_88 = *(undefined8 *)(local_220[1] + 0x18);
        local_138 = local_228;
        local_c0 = *(undefined8 *)*local_228;
        uStack_b8 = *(undefined8 *)(*local_228 + 8);
        uStack_b0 = *(undefined8 *)(*local_228 + 0x10);
        uStack_a8 = *(undefined8 *)(*local_228 + 0x18);
        local_140 = local_228 + 1;
        local_e0 = *(undefined8 *)*local_140;
        uStack_d8 = *(undefined8 *)(local_228[1] + 8);
        uStack_d0 = *(undefined8 *)(local_228[1] + 0x10);
        uStack_c8 = *(undefined8 *)(local_228[1] + 0x18);
        auVar1 = vmaxps_avx(*local_220,*local_130);
        auVar2 = vmaxps_avx(*local_228,*local_140);
        local_2e0 = auVar1._0_8_;
        local_100 = local_2e0;
        uStack_2d8 = auVar1._8_8_;
        uStack_f8 = uStack_2d8;
        uStack_2d0 = auVar1._16_8_;
        uStack_f0 = uStack_2d0;
        uStack_2c8 = auVar1._24_8_;
        uStack_e8 = uStack_2c8;
        local_300 = auVar2._0_8_;
        local_120 = local_300;
        uStack_2f8 = auVar2._8_8_;
        uStack_118 = uStack_2f8;
        uStack_2f0 = auVar2._16_8_;
        uStack_110 = uStack_2f0;
        uStack_2e8 = auVar2._24_8_;
        uStack_108 = uStack_2e8;
        _local_320 = vmaxps_avx(auVar1,auVar2);
        local_38 = local_1c0;
        local_60 = local_320;
        uStack_48 = uStack_308;
        *(undefined8 *)local_1c0 = local_320;
        *(undefined8 *)(local_1c0 + 2) = local_320._8_8_;
        *(Mat **)(local_1c0 + 4) = this;
        *(undefined8 *)(local_1c0 + 6) = uStack_308;
        local_220 = local_220 + 2;
        local_228 = local_228 + 2;
        local_1c0 = local_1c0 + 8;
        uStack_58 = local_320._8_8_;
        uStack_50 = this;
      }
      local_220 = (undefined1 (*) [32])(*local_220 + (long)local_16c * 4);
      local_228 = (undefined1 (*) [32])(*local_228 + (long)local_16c * 4);
    }
    Mat::~Mat((Mat *)0x4c6000);
  }
  return;
}

Assistant:

static void pooling2x2s2_max_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 8;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;

            for (; j < outw; j++)
            {
                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);

                __m256 _max0 = _mm256_max_ps(_r00, _r01);
                __m256 _max1 = _mm256_max_ps(_r10, _r11);
                __m256 _max = _mm256_max_ps(_max0, _max1);

                _mm256_storeu_ps(outptr, _max);

                r0 += 16;
                r1 += 16;
                outptr += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
        }
    }
}